

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Initialize(ImGuiContext *context)

{
  ImGuiID IVar1;
  ImGuiViewportP *this;
  undefined1 *in_RDI;
  ImGuiViewportP *viewport;
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  ImGuiSettingsHandler *v;
  ImVector<ImGuiSettingsHandler> *in_stack_ffffffffffffff70;
  ImVector<ImGuiViewportP_*> *this_00;
  char *local_58;
  undefined4 in_stack_ffffffffffffffb4;
  
  v = (ImGuiSettingsHandler *)&local_58;
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)0x118ebd);
  local_58 = "Window";
  IVar1 = ImHashStr("Window",0,0);
  ImVector<ImGuiSettingsHandler>::push_back(in_stack_ffffffffffffff70,v);
  TableSettingsInstallHandler((ImGuiContext *)CONCAT44(in_stack_ffffffffffffffb4,IVar1));
  this_00 = (ImVector<ImGuiViewportP_*> *)0xb8;
  MemAlloc(0xb8);
  this = (ImGuiViewportP *)operator_new(this_00);
  ImGuiViewportP::ImGuiViewportP(this);
  ImVector<ImGuiViewportP_*>::push_back(this_00,(ImGuiViewportP **)v);
  *in_RDI = 1;
  return;
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

    // Add .ini handle for ImGuiTable type
    TableSettingsInstallHandler(context);

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);

#ifdef IMGUI_HAS_DOCK
#endif

    g.Initialized = true;
}